

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

uint32 __thiscall rw::StreamMemory::write8(StreamMemory *this,void *data,uint32 len)

{
  uint uVar1;
  int iVar2;
  uint32 uVar3;
  uint32 uVar4;
  size_t __n;
  
  __n = (size_t)len;
  iVar2 = (*(this->super_Stream)._vptr_Stream[7])();
  uVar4 = 0;
  if ((char)iVar2 == '\0') {
    uVar1 = this->position;
    if (this->length < uVar1 + len) {
      __n = (size_t)(this->capacity - uVar1);
      if (uVar1 + len <= this->capacity) {
        __n = (size_t)len;
      }
      this->length = (int)__n + uVar1;
    }
    uVar4 = (uint32)__n;
    memcpy(this->data + uVar1,data,__n);
    uVar3 = 0xffffffff;
    if (uVar4 == len) {
      uVar3 = this->position + uVar4;
    }
    this->position = uVar3;
  }
  return uVar4;
}

Assistant:

uint32
StreamMemory::write8(const void *data, uint32 len)
{
	if(this->eof())
		return 0;
	uint32 l = len;
	if(this->position+l > this->length){
		if(this->position+l > this->capacity)
			l = this->capacity-this->position;
		this->length = this->position+l;
	}
	memcpy(&this->data[this->position], data, l);
	this->position += l;
	if(len != l)
		this->position = S_EOF;
	return l;
}